

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O2

void __thiscall Clasp::CBConsequences::QueryFinder::updateOpen(QueryFinder *this,Solver *s)

{
  size_type *psVar1;
  ValueVec pVVar2;
  pointer pLVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  pointer puVar9;
  
  uVar4 = (this->open_).ebo_.size;
  uVar6 = 0;
LAB_0017909c:
  do {
    if (uVar4 == uVar6) {
      return;
    }
    uVar5 = (this->open_).ebo_.buf[uVar6].rep_;
    uVar7 = (ulong)(uVar5 >> 2);
    puVar9 = (s->assign_).assign_.ebo_.buf;
    if ((*(byte *)((long)puVar9 + (ulong)(uVar5 & 0xfffffffc)) & 3) == 0) {
      if ((this->state_->value_[uVar7].super___atomic_base<unsigned_char>._M_i >>
           ((byte)uVar5 >> 1 & 1) & 4) != 0) {
        uVar6 = uVar6 + 1;
        goto LAB_0017909c;
      }
      uVar5 = (this->open_).ebo_.buf[uVar6].rep_;
      puVar9 = (s->assign_).assign_.ebo_.buf;
      uVar7 = (ulong)(uVar5 >> 2);
    }
    bVar8 = (byte)puVar9[uVar7] & 3;
    pVVar2 = this->state_->value_;
    if (bVar8 == (byte)(2U - ((uVar5 & 2) == 0))) {
      LOCK();
      pVVar2[uVar7].super___atomic_base<unsigned_char>._M_i = bVar8;
      UNLOCK();
    }
    else {
      bVar8 = (byte)uVar5 >> 1 & 1;
      if ((pVVar2[uVar7].super___atomic_base<unsigned_char>._M_i >> bVar8 & 4) != 0) {
        LOCK();
        this->state_->value_[uVar7].super___atomic_base<unsigned_char>._M_i = 0 >> bVar8;
        UNLOCK();
      }
    }
    pLVar3 = (this->open_).ebo_.buf;
    pLVar3[uVar6].rep_ = pLVar3[(this->open_).ebo_.size - 1].rep_;
    psVar1 = &(this->open_).ebo_.size;
    *psVar1 = *psVar1 - 1;
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

bool CBConsequences::QueryFinder::doUpdate(Solver& s) {
	bool newQ = !state_->open(query_);
	if (newQ || s.value(query_.var()) == value_free) { // query was SAT/UNSAT or solved by other thread
		if (!popQuery(s)) { return false; }
		assert(s.decisionLevel() == s.rootLevel());
		return newQ && !selectOpen(s, query_) ? s.force(query_ = lit_false(), this) : s.pushRoot(~query_);
	}
	return true;
}